

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O1

void __thiscall
Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::Clear
          (ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *this)

{
  DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
  *pDVar1;
  DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
  *pDVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> **ppSVar6;
  bool bVar7;
  undefined1 local_40 [8];
  Iterator __iter;
  
  pDVar1 = &this->scriptRegistrations;
  local_40 = (undefined1  [8])pDVar1;
  __iter.list = pDVar1;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  bVar7 = false;
  while( true ) {
    if (__iter.list ==
        (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                                  ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    pDVar2 = ((__iter.list)->
             super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
             ).next.list;
    __iter.list = (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
                   *)0x0;
    if ((undefined1  [8])pDVar2 == local_40) break;
    __iter.list = pDVar2;
    ppSVar6 = DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
              ::Iterator::Data((Iterator *)local_40);
    ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::Clear
              (*ppSVar6,true);
    bVar7 = true;
  }
  if (bVar7) {
    (this->scriptRegistrations).
    super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
    .next.list = pDVar1;
    (this->scriptRegistrations).
    super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
    .prev.list = pDVar1;
    (this->scriptRegistrations).super_RealCount.count = 0;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Reset
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this);
  }
  return;
}

Assistant:

void
ThreadCacheRegistry<T>::Clear()
{
    bool hasItem = false;
    FOREACH_DLISTBASE_ENTRY(ScriptCacheRegistry<T>*, registration, &this->scriptRegistrations)
    {
        registration->Clear(true /* isThreadClear */);
        hasItem = true;
    }
    NEXT_DLISTBASE_ENTRY;

    if (!hasItem)
    {
        return;
    }

    this->scriptRegistrations.Reset();
    this->arena.Reset();
}